

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Comparison.hpp
# Opt level: O2

bool CoreML::Specification::operator==
               (Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>
                *a,Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>
                   *b)

{
  value_type *key;
  long *plVar1;
  bool bVar2;
  const_iterator __begin0;
  const_iterator local_58;
  iterator_base<const_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>::KeyValuePair>
  local_40;
  
  if (a->elements_->num_elements_ == b->elements_->num_elements_) {
    google::protobuf::
    Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>::
    begin((const_iterator *)&local_40,a);
    while (bVar2 = local_40.node_ == (Node *)0x0, !bVar2) {
      key = ((local_40.node_)->kv).v_;
      google::protobuf::
      Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>::
      find(&local_58,b,&key->first);
      if (local_58.it_.node_ == (Node *)0x0) {
        return bVar2;
      }
      plVar1 = google::protobuf::
               Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>
               ::at(b,&key->first);
      if (*plVar1 != key->second) {
        return bVar2;
      }
      google::protobuf::
      Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>::
      InnerMap::
      iterator_base<const_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>::KeyValuePair>
      ::operator++(&local_40);
    }
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool operator==(const ::google::protobuf::Map<T,U>& a,
                        const ::google::protobuf::Map<T,U>& b) {
            if (a.size() != b.size()) {
                return false;
            }
            for (const auto& pair : a) {
                if (b.find(pair.first) == b.end()) {
                    return false;
                }
                if (b.at(pair.first) != pair.second) {
                    return false;
                }
            }
            return true;
        }